

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

int uv__udp_is_connected(uv_udp_t *handle)

{
  int iVar1;
  int local_9c;
  undefined1 local_98 [4];
  int addrlen;
  sockaddr_storage addr;
  uv_udp_t *handle_local;
  
  if (handle->type == UV_UDP) {
    local_9c = 0x80;
    addr.__ss_align = (unsigned_long)handle;
    iVar1 = uv_udp_getpeername(handle,(sockaddr *)local_98,&local_9c);
    if (iVar1 == 0) {
      handle_local._4_4_ = (uint)(0 < local_9c);
    }
    else {
      handle_local._4_4_ = 0;
    }
  }
  else {
    handle_local._4_4_ = 0;
  }
  return handle_local._4_4_;
}

Assistant:

int uv__udp_is_connected(uv_udp_t* handle) {
  struct sockaddr_storage addr;
  int addrlen;
  if (handle->type != UV_UDP)
    return 0;

  addrlen = sizeof(addr);
  if (uv_udp_getpeername(handle, (struct sockaddr*) &addr, &addrlen) != 0)
    return 0;

  return addrlen > 0;
}